

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnlineProofChecker.h
# Opt level: O1

bool __thiscall
Minisat::OnlineProofChecker::addClause
          (OnlineProofChecker *this,vec<Minisat::Lit> *cls,bool checkOnly)

{
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  int iVar1;
  uint uVar2;
  iterator __position;
  Lit *pLVar3;
  Lit LVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ostream *poVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  long *plVar13;
  byte bVar14;
  long lVar15;
  long lVar16;
  anon_struct_8_10_eb538618_for_header *cls_00;
  CRef ref;
  Lit resolveLit;
  Lit local_64;
  ostream *local_60;
  Watcher local_58;
  vec<Minisat::Lit> *local_50;
  undefined4 local_44;
  long *local_40;
  ulong local_38;
  
  if (*this != (OnlineProofChecker)0x1) {
    return true;
  }
  iVar1 = *(int *)(this + 0xe0);
  if (0 < cls->sz) {
    lVar15 = 0;
    do {
      while (*(int *)(this + 0xe0) <= cls->data[lVar15].x >> 1) {
        newVar(this);
      }
      lVar15 = lVar15 + 1;
    } while (lVar15 < cls->sz);
  }
  if (3 < *(int *)(this + 0xf8)) {
    local_50 = (vec<Minisat::Lit> *)CONCAT44(local_50._4_4_,iVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] add/check clause ",0x1f);
    if (0 < cls->sz) {
      lVar15 = 0;
      do {
        uVar2 = cls->data[lVar15].x;
        uVar11 = (int)uVar2 >> 1;
        uVar12 = ~uVar11;
        if ((uVar2 & 1) == 0) {
          uVar12 = uVar11 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cerr,uVar12);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
        lVar15 = lVar15 + 1;
      } while (lVar15 < cls->sz);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    printState(this);
    iVar1 = (int)local_50;
  }
  if (0 < (long)*(int *)(this + 0xc0)) {
    lVar15 = (long)*(int *)(this + 0xc0) + 1;
    do {
      *(undefined1 *)
       (*(long *)(this + 0xd8) + (long)(*(int *)(*(long *)(this + 0xb8) + -8 + lVar15 * 4) >> 1)) =
           2;
      lVar15 = lVar15 + -1;
    } while (1 < lVar15);
  }
  *(undefined4 *)(this + 0xb0) = 0;
  if (*(long *)(this + 0xb8) != 0) {
    *(undefined4 *)(this + 0xc0) = 0;
  }
  bVar6 = 0 < cls->sz;
  if (0 < cls->sz) {
    lVar15 = 0;
    do {
      uVar2 = cls->data[lVar15].x;
      if ((*(byte *)(*(long *)(this + 0xd8) + (long)((int)uVar2 >> 1)) & 2) == 0) {
        if (((byte)uVar2 & 1) == *(byte *)(*(long *)(this + 0xd8) + (long)((int)uVar2 >> 1)))
        goto LAB_0010ab34;
      }
      else {
        uncheckedEnqueue(this,(Lit)(uVar2 ^ 1));
      }
      lVar15 = lVar15 + 1;
      bVar6 = lVar15 < cls->sz;
    } while (lVar15 < cls->sz);
  }
  if (3 < *(int *)(this + 0xf8)) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"c [DRAT-OTFC] clause does not conflict by pure enquing ",0x37)
    ;
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
  }
  bVar5 = propagate(this);
  uVar2 = *(uint *)(this + 0xf8);
  uVar9 = (ulong)uVar2;
  if (bVar5) {
    if (3 < (int)uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is DRUP ",0x1d);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
  }
  else {
    if (3 < (int)uVar2) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] clause is not DRUP ",0x21);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
    if (*(int *)(this + 4) != 2) {
      if (1 < *(int *)(this + 0xf8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
        if (0 < cls->sz) {
          lVar15 = 0;
          do {
            uVar2 = cls->data[lVar15].x;
            uVar11 = (int)uVar2 >> 1;
            uVar12 = ~uVar11;
            if ((uVar2 & 1) == 0) {
              uVar12 = uVar11 + 1;
            }
            std::ostream::operator<<((ostream *)&std::cerr,uVar12);
            std::ostream::flush();
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
            lVar15 = lVar15 + 1;
          } while (lVar15 < cls->sz);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr," is not a DRUP clause, and we do not check DRAT",0x2f);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
        std::ostream::put(' ');
        std::ostream::flush();
      }
      printState(this);
      return false;
    }
    if (cls->sz == 0 && checkOnly) {
      return false;
    }
    if (cls->data->x >> 1 <= iVar1) {
      if (0x3fffffff < *(uint *)(this + 0xa8)) {
        memset(*(void **)(this + 0x90),0,*(long *)(this + 0x98) - (long)*(void **)(this + 0x90));
        *(undefined4 *)(this + 0xa8) = 0;
      }
      *(int *)(this + 0xa8) = *(int *)(this + 0xa8) + 1;
      if (*(long *)(this + 200) != 0) {
        *(undefined4 *)(this + 0xd0) = 0;
      }
      local_50 = (vec<Minisat::Lit> *)(this + 200);
      if (1 < cls->sz) {
        lVar16 = 1;
        lVar15 = 4;
        do {
          pLVar3 = cls->data;
          uVar10 = (ulong)*(uint *)((long)&pLVar3->x + lVar15);
          uVar9 = *(ulong *)(this + 0x90);
          if (*(int *)(uVar9 + (uVar10 ^ 1) * 4) == *(int *)(this + 0xa8)) goto LAB_0010ab34;
          *(int *)(uVar9 + uVar10 * 4) = *(int *)(this + 0xa8);
          vec<Minisat::Lit>::push(local_50,(Lit *)((long)&pLVar3->x + lVar15));
          lVar16 = lVar16 + 1;
          lVar15 = lVar15 + 4;
        } while (lVar16 < cls->sz);
      }
      if (!bVar6) {
        local_44 = *(undefined4 *)(this + 0xd0);
        local_58.cref = cls->data->x;
        if (3 < *(int *)(this + 0xf8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] use literal ",0x1a);
          poVar8 = operator<<((ostream *)&std::cerr,(Lit *)&local_58);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," for DRAT check",0xf);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        plVar13 = (long *)(((long)(int)local_58.cref ^ 1U) * 0x18 + *(long *)(this + 0x40));
        if (4 < *(int *)(this + 0xf8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"c [DRAT-OTFC] resolve against ",0x1e);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," clauses",8);
          std::endl<char,std::char_traits<char>>(poVar8);
        }
        lVar15 = *plVar13;
        if (plVar13[1] == lVar15) {
          bVar7 = 0;
          bVar14 = 0xd;
        }
        else {
          local_60 = (ostream *)CONCAT44(local_60._4_4_,(int)CONCAT71((int7)(uVar9 >> 8),1));
          uVar9 = 0;
          local_40 = plVar13;
          do {
            *(undefined4 *)(this + 0xd0) = local_44;
            cls_00 = (anon_struct_8_10_eb538618_for_header *)
                     ((ulong)*(uint *)(lVar15 + uVar9 * 4) * 4 + *(long *)(this + 8));
            local_38 = uVar9;
            if (4 < *(int *)(this + 0xf8)) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cerr,"c [DRAT-OTFC] resolve with clause ",0x22);
              if (0x3ffffffff < (ulong)*cls_00) {
                uVar9 = 0;
                do {
                  uVar12 = (int)*(uint *)(&cls_00[1].field_0x0 + uVar9 * 4) >> 1;
                  uVar2 = ~uVar12;
                  if ((*(uint *)(&cls_00[1].field_0x0 + uVar9 * 4) & 1) == 0) {
                    uVar2 = uVar12 + 1;
                  }
                  std::ostream::operator<<((ostream *)&std::cerr,uVar2);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                  uVar9 = uVar9 + 1;
                } while (uVar9 < (ulong)*cls_00 >> 0x22);
              }
              std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
              std::ostream::put(' ');
              std::ostream::flush();
            }
            uVar9 = (ulong)*cls_00 >> 0x22;
            uVar10 = 0;
            if (0x3ffffffff < (ulong)*cls_00) {
              uVar10 = 0;
              do {
                uVar2 = *(uint *)(&cls_00[1].field_0x0 + uVar10 * 4);
                if ((local_58.cref ^ uVar2) != 1) {
                  if (*(int *)(*(long *)(this + 0x90) + ((ulong)uVar2 ^ 1) * 4) ==
                      *(int *)(this + 0xa8)) break;
                  if (*(int *)(*(long *)(this + 0x90) + (ulong)uVar2 * 4) != *(int *)(this + 0xa8))
                  {
                    local_64.x = *(int *)(&cls_00[1].field_0x0 + uVar10 * 4);
                    vec<Minisat::Lit>::push(local_50,&local_64);
                  }
                }
                uVar10 = uVar10 + 1;
                uVar9 = (ulong)*cls_00 >> 0x22;
              } while (uVar10 < uVar9);
            }
            if ((int)uVar10 == (int)uVar9) {
              if (3 < *(int *)(this + 0xf8)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] test resolvent ",0x1d);
                if (0 < *(int *)(this + 0xd0)) {
                  lVar15 = 0;
                  do {
                    uVar2 = *(uint *)(*(long *)(this + 200) + lVar15 * 4);
                    uVar11 = (int)uVar2 >> 1;
                    uVar12 = ~uVar11;
                    if ((uVar2 & 1) == 0) {
                      uVar12 = uVar11 + 1;
                    }
                    std::ostream::operator<<((ostream *)&std::cerr,uVar12);
                    std::ostream::flush();
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
                    lVar15 = lVar15 + 1;
                  } while (lVar15 < *(int *)(this + 0xd0));
                }
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
              }
              if (0 < (long)*(int *)(this + 0xc0)) {
                lVar15 = (long)*(int *)(this + 0xc0) + 1;
                do {
                  *(undefined1 *)
                   (*(long *)(this + 0xd8) +
                   (long)(*(int *)(*(long *)(this + 0xb8) + -8 + lVar15 * 4) >> 1)) = 2;
                  lVar15 = lVar15 + -1;
                } while (1 < lVar15);
              }
              *(undefined4 *)(this + 0xb0) = 0;
              if (*(long *)(this + 0xb8) != 0) {
                *(undefined4 *)(this + 0xc0) = 0;
              }
              if (0 < *(int *)(this + 0xd0)) {
                lVar15 = 0;
                do {
                  uVar2 = *(uint *)(*(long *)(this + 200) + lVar15 * 4);
                  if ((*(byte *)(*(long *)(this + 0xd8) + (long)((int)uVar2 >> 1)) & 2) == 0) {
                    if (((byte)uVar2 & 1) ==
                        *(byte *)(*(long *)(this + 0xd8) + (long)((int)uVar2 >> 1))) {
                      if (4 < *(int *)(this + 0xf8)) {
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                        poVar8 = operator<<((ostream *)&std::cerr,cls);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar8," conflicts during enqueing its literals",0x27);
                        std::endl<char,std::char_traits<char>>(poVar8);
                      }
                      goto LAB_0010b22d;
                    }
                  }
                  else {
                    uncheckedEnqueue(this,(Lit)(uVar2 ^ 1));
                  }
                  lVar15 = lVar15 + 1;
                } while (lVar15 < *(int *)(this + 0xd0));
              }
              bVar6 = propagate(this);
              if (bVar6) {
LAB_0010b22d:
                bVar14 = 0;
                if (6 < *(int *)(this + 0xf8)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                  if (0 < cls->sz) {
                    lVar15 = 0;
                    do {
                      uVar2 = cls->data[lVar15].x;
                      uVar11 = (int)uVar2 >> 1;
                      uVar12 = ~uVar11;
                      if ((uVar2 & 1) == 0) {
                        uVar12 = uVar11 + 1;
                      }
                      std::ostream::operator<<((ostream *)&std::cerr,uVar12);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cerr," ",1);
                      lVar15 = lVar15 + 1;
                    } while (lVar15 < cls->sz);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr," conflicts during enqueing/propagating",0x26);
                  std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                  std::ostream::put(' ');
                  std::ostream::flush();
                }
              }
              else {
                if (1 < *(int *)(this + 0xf8)) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,"c [DRAT-OTFC] the clause ",0x19);
                  local_60 = operator<<((ostream *)&std::cerr,cls);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_60," is not a DRAT clause -- resolution on ",0x27);
                  local_60 = operator<<(local_60,(Lit *)&local_58);
                  std::__ostream_insert<char,std::char_traits<char>>(local_60," with ",6);
                  poVar8 = operator<<(local_60,(Clause *)cls_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," failed! (does not result in a conflict with UP)",0x30);
                  std::endl<char,std::char_traits<char>>(poVar8);
                }
                printState(this);
                bVar14 = 1;
                local_60 = (ostream *)((ulong)local_60 & 0xffffffff00000000);
              }
            }
            else {
              bVar14 = 0xf;
              if (4 < *(int *)(this + 0xf8)) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cerr,"c [DRAT-OTFC] resolvent is tautology",0x24);
                std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
                std::ostream::put(' ');
                std::ostream::flush();
              }
            }
            if ((bVar14 != 0xf) && (bVar14 != 0)) goto LAB_0010b30e;
            uVar9 = local_38 + 1;
            lVar15 = *local_40;
          } while (uVar9 < (ulong)(local_40[1] - lVar15 >> 2));
          bVar14 = 0xd;
LAB_0010b30e:
          bVar7 = ~(byte)local_60 & 1;
        }
        if (bVar14 != 0xd) {
          bVar7 = bVar14;
        }
        if (bVar7 != 0 || checkOnly) {
          return bVar7 == 0;
        }
        goto LAB_0010ab3d;
      }
    }
  }
LAB_0010ab34:
  if (checkOnly) {
    return true;
  }
LAB_0010ab3d:
  if (cls->sz == 0) {
    *this = (OnlineProofChecker)0x0;
  }
  else {
    if (cls->sz < 2) {
      vec<Minisat::Lit>::push((vec<Minisat::Lit> *)(this + 0x30),cls->data);
    }
    else {
      local_64.x = ClauseAllocator::alloc<Minisat::vec<Minisat::Lit>>
                             ((ClauseAllocator *)(this + 8),cls,false);
      if (0 < cls->sz) {
        lVar15 = 0;
        do {
          this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)
                    (*(long *)(this + 0x40) + (long)cls->data[lVar15].x * 0x18);
          __position._M_current = *(uint **)(this_00 + 8);
          if (__position._M_current == *(uint **)(this_00 + 0x10)) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>(this_00,__position,(uint *)&local_64);
          }
          else {
            *__position._M_current = local_64.x;
            *(uint **)(this_00 + 8) = __position._M_current + 1;
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < cls->sz);
      }
      LVar4.x = local_64.x;
      uVar9 = (ulong)(uint)local_64.x;
      lVar15 = *(long *)(this + 8);
      local_58.blocker.x = *(int *)(lVar15 + 0xc + uVar9 * 4);
      local_58.cref = local_64.x;
      vec<Minisat::Watcher>::push
                ((vec<Minisat::Watcher> *)
                 (((long)*(int *)(lVar15 + 8 + uVar9 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
                 &local_58);
      local_58.blocker.x = *(int *)(lVar15 + 8 + uVar9 * 4);
      local_58.cref = LVar4.x;
      vec<Minisat::Watcher>::push
                ((vec<Minisat::Watcher> *)
                 (((long)*(int *)(lVar15 + 0xc + uVar9 * 4) ^ 1U) * 0x10 + *(long *)(this + 0x58)),
                 &local_58);
      vec<unsigned_int>::push((vec<unsigned_int> *)(this + 0x20),(uint *)&local_64);
    }
    if (1 < *(int *)(this + 0xf8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"c [DRAT-OTFC] added the clause ",0x1f);
      if (0 < cls->sz) {
        lVar15 = 0;
        do {
          uVar2 = cls->data[lVar15].x;
          uVar11 = (int)uVar2 >> 1;
          uVar12 = ~uVar11;
          if ((uVar2 & 1) == 0) {
            uVar12 = uVar11 + 1;
          }
          std::ostream::operator<<((ostream *)&std::cerr,uVar12);
          std::ostream::flush();
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," ",1);
          lVar15 = lVar15 + 1;
        } while (lVar15 < cls->sz);
      }
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
    }
  }
  return true;
}

Assistant:

inline bool OnlineProofChecker::addClause(const vec<Lit> &cls, bool checkOnly)
{
    if (!ok) {
        return true;
    } // trivially true, we reached the empty clause already!
    bool conflict = false;

    const int initialVars = nVars();

    // have enough variables present
    for (int i = 0; i < cls.size(); ++i) {
        while (nVars() <= var(cls[i])) {
            newVar();
        }
    }

    if (verbose > 3) {
        std::cerr << "c [DRAT-OTFC] add/check clause " << cls << std::endl;
        printState();
    }

    // enqueue all complementary literals!
    cancelUntil();
    for (int i = 0; i < cls.size(); ++i) {
        if (value(cls[i]) == l_Undef) {
            uncheckedEnqueue(~cls[i]);
        } else if (value(~cls[i]) == l_False) {
            conflict = true;
            break;
        }
    }

    if (!conflict) {
        DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause does not conflict by pure enquing " << std::endl;);
        if (propagate()) {
            conflict = true; // DRUP!
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is DRUP " << std::endl;);
        } else {
            DOUT(if (verbose > 3) std::cerr << "c [DRAT-OTFC] clause is not DRUP " << std::endl;);
            if (proof == dratProof) { // are we checking DRAT?
                if (cls.size() == 0 && checkOnly) {
                    return false;
                }
                assert(cls.size() > 0 && "checking the empty clause cannot reach here (it can only be a RUP clause, "
                                         "not a RAT clause -- empty clause is not entailed");
                if (initialVars >= var(cls[0])) { // DRAT on the first variable, because this variable is not present before!
                    // build all resolents on the first literal!
                    ma.nextStep();
                    lits.clear();
                    for (int i = 1; i < cls.size(); ++i) {
                        if (ma.isCurrentStep(toInt(~cls[i]))) {
                            conflict = true;
                            break;
                        }                                 // clause has complementary literals, accept it!
                        ma.setCurrentStep(toInt(cls[i])); // mark all except the first literal!
                        lits.push(cls[i]);
                    }
                    if (!conflict) {
                        const int initialSize =
                        lits.size(); // these literals are added by resolving with  the current clause on its first literal
                        assert(initialSize + 1 == cls.size() &&
                               "initial resolvent size has all literals except the literal to resolve on");
                        const Lit resolveLit = cls[0];
                        if (verbose > 3) {
                            std::cerr << "c [DRAT-OTFC] use literal " << resolveLit << " for DRAT check" << std::endl;
                        }
                        conflict = true;
                        const std::vector<CRef> &list = occ[toInt(~resolveLit)];
                        bool resovleConflict = false;
                        if (verbose > 4) {
                            std::cerr << "c [DRAT-OTFC] resolve against " << list.size() << " clauses" << std::endl;
                        }
                        for (size_t i = 0; i < list.size(); ++i) {
                            // build resolvent
                            lits.shrink_(lits.size() - initialSize); // remove literals from previous addClause call
                            const Clause &d = ca[list[i]];
                            if (verbose > 4) {
                                std::cerr << "c [DRAT-OTFC] resolve with clause " << d << std::endl;
                            }
                            int j = 0;
                            for (; j < d.size(); ++j) {
                                if (d[j] == ~resolveLit) {
                                    continue;
                                } // this literal is used for resolution
                                if (ma.isCurrentStep(toInt(~d[j]))) {
                                    break;
                                } // resolvent is a tautology
                                if (!ma.isCurrentStep(toInt(d[j]))) {
                                    // ma.setCurrentStep( toInt(d[j]) );  // do not do this, because there are multiple
                                    // resolvents! // this step might be redundant -- however, here we can ensure that also clauses with duplicate literals can be handled, as well as tautologic clauses!
                                    lits.push(d[j]);
                                }
                            }
                            if (j != d.size()) {
                                if (verbose > 4) {
                                    std::cerr << "c [DRAT-OTFC] resolvent is tautology" << std::endl;
                                }
                                continue; // this resolvent would be tautological!
                            }
                            // lits contains all literals of the resolvent, propagate and check for the conflict!

                            if (verbose > 3) {
                                std::cerr << "c [DRAT-OTFC] test resolvent " << lits << std::endl;
                            }
                            // enqueue all complementary literals!
                            resovleConflict = false;
                            cancelUntil();
                            for (int k = 0; k < lits.size(); ++k) {
                                if (value(lits[k]) == l_Undef) {
                                    uncheckedEnqueue(~lits[k]);
                                } else if (value(~lits[k]) == l_False) {
                                    resovleConflict = true;
                                    DOUT(if (verbose > 4) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                    << " conflicts during enqueing its literals" << std::endl;);
                                    break;
                                } // the clause itself is tautological ...
                            }
                            if (!resovleConflict && !propagate()) {
                                conflict = false; // not DRAT, the current resolvent does not lead to a conflict!
                                if (verbose > 1) {
                                    std::cerr << "c [DRAT-OTFC] the clause " << cls
                                              << " is not a DRAT clause -- resolution on " << resolveLit << " with "
                                              << d << " failed! (does not result in a conflict with UP)" << std::endl;
                                }
                                printState();
                                assert(false && "added clause has to be a DRAT clause");
                                return false;
                            } else {
                                DOUT(if (verbose > 6) std::cerr << "c [DRAT-OTFC] the clause " << cls
                                                                << " conflicts during enqueing/propagating" << std::endl;);
                            }
                        }
                        assert(conflict && "added clause has to be a DRAT clause");
                        if (!conflict) {
                            return false;
                        }
                    } // else conflict == true
                } else {
                    conflict = true;
                } // DRAT, because we have a fresh variable!
            } else {
                if (verbose > 1) {
                    std::cerr << "c [DRAT-OTFC] the clause " << cls << " is not a DRUP clause, and we do not check DRAT"
                              << std::endl;
                }
                printState();
                assert(false && "added clause has to be a DRUP clause");
                return false;
            }
        }
    }

    // do not actually add the clause
    if (checkOnly) {
        return true;
    }

    // add the clause ...
    if (cls.size() == 0) {
        ok = false;
        return true;
    }

    if (cls.size() > 1) {
        CRef ref = ca.alloc(cls, false);
        for (int i = 0; i < cls.size(); ++i) {
            occ[toInt(cls[i])].push_back(ref);
        }
        attachClause(ref);
        clauses.push(ref);
    } else {
        unitClauses.push(cls[0]);
    }
    if (verbose > 1) {
        std::cerr << "c [DRAT-OTFC] added the clause " << cls << std::endl;
    }
    return true;
}